

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

void dgrminer::find_addition_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *from_pattern_id_to_adj_id_map,int num_of_nondummy_nodes,
               vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               *edge_mapping_sets,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               bool debug)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  iterator iVar7;
  pointer paVar8;
  int iVar9;
  size_t i;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  reference rVar16;
  reference rVar17;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<int,_std::allocator<int>_> which_indices_should_be_used_next;
  vector<bool,_std::allocator<bool>_> is_the_used_edge_dummy;
  set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
  edge_mapping_set;
  int_pair edge_mapping_pair;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_more_info;
  set<int,_std::less<int>,_std::allocator<int>_> which_edge_ids_are_used;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&adj_list,&adjacency_list->adjacencyList);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&adj_more_info,&adjacency_list->adjacencyEdgeInfo);
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_offset = 0;
  is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_offset = 0;
  is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_end_of_storage = (_Bit_pointer)0x0;
  which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_header;
  which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edge_mapping_set._M_t._M_impl._0_4_ = 0;
  which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&which_indices_should_be_used_next,(int *)&edge_mapping_set);
  iVar11 = 0;
LAB_0010e133:
  do {
    if (debug) {
      poVar4 = std::operator<<((ostream *)&std::cout,"CURRENT INDEX: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    paVar8 = (antecedent_pattern_edges_ADDED->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)iVar11;
    if ((ulong)(((long)(antecedent_pattern_edges_ADDED->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)paVar8) / 0x28) <= uVar10
       ) {
      edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_header;
      edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar14 = 9;
      edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar10 = 0;
          uVar10 < (ulong)((long)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar10 = uVar10 + 1) {
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&is_the_used_edge_dummy,uVar10);
        if ((*rVar16._M_p & rVar16._M_mask) == 0) {
          edge_mapping_pair.first =
               ((antecedent_pattern_edges_ADDED->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar14];
          edge_mapping_pair.second =
               selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
          std::
          _Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
          ::_M_insert_unique<dgrminer::int_pair_const&>
                    ((_Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
                      *)&edge_mapping_set,&edge_mapping_pair);
        }
        lVar14 = lVar14 + 10;
      }
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back(edge_mapping_sets,(value_type *)&edge_mapping_set);
      rVar17 = std::vector<bool,_std::allocator<bool>_>::back(&is_the_used_edge_dummy);
      which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      if ((*rVar17._M_p & rVar17._M_mask) == 0) {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                  (&which_edge_ids_are_used._M_t,
                   selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1);
      }
      bVar15 = is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
      is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
           is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar15) {
        is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
             is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
      }
      selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      iVar11 = iVar11 + -1;
      std::
      _Rb_tree<dgrminer::int_pair,_dgrminer::int_pair,_std::_Identity<dgrminer::int_pair>,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
      ::~_Rb_tree((_Rb_tree<dgrminer::int_pair,_dgrminer::int_pair,_std::_Identity<dgrminer::int_pair>,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
                   *)&edge_mapping_set);
      paVar8 = (antecedent_pattern_edges_ADDED->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (ulong)iVar11;
    }
    edge_mapping_set._M_t._M_impl._0_1_ = *(undefined1 *)paVar8[uVar10]._M_elems;
    pmVar5 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](from_pattern_id_to_adj_id_map,(key_type_conflict *)&edge_mapping_set);
    iVar1 = *pmVar5;
    edge_mapping_set._M_t._M_impl._0_1_ =
         (char)(antecedent_pattern_edges_ADDED->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar10]._M_elems[1];
    pmVar5 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](from_pattern_id_to_adj_id_map,(key_type_conflict *)&edge_mapping_set);
    iVar2 = *pmVar5;
    iVar9 = which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10];
    uVar13 = (ulong)iVar9;
    if (iVar1 < num_of_nondummy_nodes && iVar2 < num_of_nondummy_nodes) {
      uVar12 = uVar13 << 5 | 0x1c;
      while( true ) {
        iVar9 = iVar9 + 1;
        piVar3 = adj_list.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar1].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((ulong)((long)adj_list.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar1].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar13) break;
        if (piVar3[uVar13] == iVar2) {
          if (debug) {
            poVar4 = std::operator<<((ostream *)&std::cout,"FOUND POSSIBLE EDGE ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
            poVar4 = std::operator<<(poVar4,", ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          bVar15 = is_adj_info_equal_to_pattern_edge
                             ((array<int,_8UL> *)
                              ((long)(adj_more_info.
                                      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                              (uVar12 - 0x1c)),
                              (antecedent_pattern_edges_ADDED->
                              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar10,true);
          iVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find(&which_edge_ids_are_used._M_t,
                         (key_type *)
                         ((long)(adj_more_info.
                                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar12));
          iVar7 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find(&edges_occupied_by_antecedent->_M_t,
                         (key_type *)
                         ((long)(adj_more_info.
                                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar12));
          if ((((_Rb_tree_header *)iVar6._M_node ==
                &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header) && (bVar15)) &&
             ((_Rb_tree_header *)iVar7._M_node ==
              &(edges_occupied_by_antecedent->_M_t)._M_impl.super__Rb_tree_header)) {
            if (debug) {
              poVar4 = std::operator<<((ostream *)&std::cout,"IT MATCHES");
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = iVar9;
            edge_mapping_set._M_t._M_impl._0_4_ = 0;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&which_indices_should_be_used_next,(int *)&edge_mapping_set);
            std::vector<bool,_std::allocator<bool>_>::push_back(&is_the_used_edge_dummy,false);
            std::vector<int,_std::allocator<int>_>::push_back
                      (&selected_ids_from_adj,
                       (value_type_conflict1 *)
                       ((long)(adj_more_info.
                               super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar1].
                               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar12));
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &which_edge_ids_are_used,
                       (int *)((long)(adj_more_info.
                                      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar12)
                      );
            iVar11 = iVar11 + 1;
            goto LAB_0010e5cb;
          }
        }
        uVar13 = uVar13 + 1;
        uVar12 = uVar12 + 0x20;
      }
      if (which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] != 0x7fffffff) {
        which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] = 0x7fffffff;
        edge_mapping_set._M_t._M_impl._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&which_indices_should_be_used_next,(int *)&edge_mapping_set);
        std::vector<bool,_std::allocator<bool>_>::push_back(&is_the_used_edge_dummy,true);
        edge_mapping_set._M_t._M_impl._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&selected_ids_from_adj,(int *)&edge_mapping_set);
LAB_0010e520:
        iVar11 = iVar11 + 1;
      }
    }
    else if (iVar9 != 0x7fffffff) {
      which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = 0x7fffffff;
      edge_mapping_set._M_t._M_impl._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&which_indices_should_be_used_next,(int *)&edge_mapping_set);
      std::vector<bool,_std::allocator<bool>_>::push_back(&is_the_used_edge_dummy,true);
      edge_mapping_set._M_t._M_impl._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&selected_ids_from_adj,(int *)&edge_mapping_set);
      goto LAB_0010e520;
    }
LAB_0010e5cb:
    if (iVar11 != 0) {
      if (which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar11] != 0x7fffffff) goto LAB_0010e133;
      rVar17 = std::vector<bool,_std::allocator<bool>_>::back(&is_the_used_edge_dummy);
      which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      if ((*rVar17._M_p & rVar17._M_mask) == 0) {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                  (&which_edge_ids_are_used._M_t,
                   selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1);
      }
      bVar15 = is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
      is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
           is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar15) {
        is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
             is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
      }
      selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      iVar11 = iVar11 + -1;
      if (iVar11 != 0) goto LAB_0010e133;
    }
    iVar11 = 0;
    if (*which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start == 0x7fffffff) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&which_edge_ids_are_used._M_t);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&adj_more_info);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&adj_list);
      return;
    }
  } while( true );
}

Assistant:

void find_addition_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::map<char, int> & from_pattern_id_to_adj_id_map, int num_of_nondummy_nodes, std::vector<std::set<int_pair>> & edge_mapping_sets,
		std::set<int> & edges_occupied_by_antecedent, bool debug)
	{
		std::vector<std::vector<int>> adj_list = adjacency_list.adjacencyList;
		std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adj_more_info = adjacency_list.adjacencyEdgeInfo;

		int special_symbol_for_max_index = std::numeric_limits<int>::max();

		int number_of_created_dummy_edges = 0;

		int current_index = 0; // which of the antecedent_pattern_edges_ADDED are we currently processing

		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<bool> is_the_used_edge_dummy;
		std::vector<int> which_indices_should_be_used_next;

		std::set<int> which_edge_ids_are_used;

		which_indices_should_be_used_next.push_back(0); // for the first addition edge, we want to start from the first neighbor in the adjacency list

		// DO DFS:
		while (true)
		{

			if (debug) cout << "CURRENT INDEX: " << current_index << endl;
			// if all ADDITION edges were mapped:
			if (antecedent_pattern_edges_ADDED.size() <= current_index)
			{
                // WE FOUND ALL EDGES (pattern --> adjacency) antecedent_pattern_edges_ADDED[i][PAT_ID] --> selected_ids_from_adj[i]

				// save all pairs PATTERN_EDGE_ID->ADJ_EDGE_ID for non-dummy edges
				std::set<int_pair> edge_mapping_set;
				for (size_t i = 0; i < selected_ids_from_adj.size(); i++)
				{
					if (!is_the_used_edge_dummy[i])
					{
						int_pair edge_mapping_pair;
						edge_mapping_pair.first = antecedent_pattern_edges_ADDED[i][PAT_ID];
						edge_mapping_pair.second = selected_ids_from_adj[i];
						edge_mapping_set.insert(edge_mapping_pair);
					}
				}
				// now save this edge_mapping_set (then we check if it is not a subset of another mapping.. and remove all subsets of this mapping)
				edge_mapping_sets.push_back(edge_mapping_set);

				// AND BACKTRACK:

				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			int src_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_SRC_ID]];
			int dst_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_DST_ID]];
			// all non_dummy nodes have ID < num_of_nondummy_nodes, so we can check which nodes are dummy by:
			bool src_is_dummy = src_id >= num_of_nondummy_nodes;
			bool dst_is_dummy = dst_id >= num_of_nondummy_nodes;

			// if at least one node of the edge is dummy, then the edge itself is dummy
			if (src_is_dummy || dst_is_dummy)
			{
				// and if we didn't just try it as dummy:
				if (which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					// map it as dummy:
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}
			// if no node of the edge is dummy, then the edge itself can be dummy but doesn't have to be
			else
			{
				bool should_try_dummy = true;

				int src_index = which_indices_should_be_used_next[current_index];

				for (; src_index < adj_list[src_id].size(); src_index++)
				{
					if (adj_list[src_id][src_index] == dst_id)
					{
						if (debug) cout << "FOUND POSSIBLE EDGE " << src_id << ", " << dst_id << endl;
						bool matches = is_adj_info_equal_to_pattern_edge(adj_more_info[src_id][src_index], antecedent_pattern_edges_ADDED[current_index], true);
						bool was_already_used = which_edge_ids_are_used.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != which_edge_ids_are_used.end();

						bool is_edge_occcupied = edges_occupied_by_antecedent.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != edges_occupied_by_antecedent.end();

						if (matches && !was_already_used && !is_edge_occcupied)
						{
							if (debug) cout << "IT MATCHES" << endl;

							should_try_dummy = false;


							which_indices_should_be_used_next[current_index] = src_index + 1;
							which_indices_should_be_used_next.push_back(0);

							is_the_used_edge_dummy.push_back(false);
							selected_ids_from_adj.push_back(adj_more_info[src_id][src_index][ADJ_INFO_ID]);

							which_edge_ids_are_used.insert(adj_more_info[src_id][src_index][ADJ_INFO_ID]);
							current_index++;
							break;
						}
					}
				}


				// if we tried all regular edges and should backtrack, try to map to a dummy edge first:
				if (should_try_dummy && which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					//which_indices_should_be_used_next[current_index] = adj_list[from_id].size() + 1;
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}

			if (current_index != 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// now we also tried the dummy one, so really backtrack
				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			if (current_index == 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// we tried all combinations, just end:
				break;
			}

		}

	}